

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arch_specific.cc
# Opt level: O2

char * highwayhash::TargetName(TargetBits target_bit)

{
  switch(target_bit) {
  case 1:
    return "Portable";
  case 2:
    return "SSE41";
  case 3:
  case 5:
  case 6:
  case 7:
    goto switchD_0010b29e_caseD_3;
  case 4:
    return "AVX2";
  case 8:
    return "VSX";
  default:
    if (target_bit == 0x10) {
      return "NEON";
    }
switchD_0010b29e_caseD_3:
    return (char *)0x0;
  }
}

Assistant:

const char* TargetName(const TargetBits target_bit) {
  switch (target_bit) {
    case HH_TARGET_Portable:
      return "Portable";
    case HH_TARGET_SSE41:
      return "SSE41";
    case HH_TARGET_AVX2:
      return "AVX2";
    case HH_TARGET_VSX:
      return "VSX";
    case HH_TARGET_NEON:
      return "NEON";
    default:
      return nullptr;  // zero, multiple, or unknown bits
  }
}